

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3_extended_errcode(sqlite3 *db)

{
  int iVar1;
  long in_RDI;
  sqlite3 *in_stack_ffffffffffffffe8;
  int local_4;
  
  if ((in_RDI != 0) && (iVar1 = sqlite3SafetyCheckSickOrOk(in_stack_ffffffffffffffe8), iVar1 == 0))
  {
    iVar1 = sqlite3MisuseError(0);
    return iVar1;
  }
  if ((in_RDI == 0) || (*(char *)(in_RDI + 0x67) != '\0')) {
    local_4 = 7;
  }
  else {
    local_4 = *(int *)(in_RDI + 0x50);
  }
  return local_4;
}

Assistant:

SQLITE_API int sqlite3_extended_errcode(sqlite3 *db){
  if( db && !sqlite3SafetyCheckSickOrOk(db) ){
    return SQLITE_MISUSE_BKPT;
  }
  if( !db || db->mallocFailed ){
    return SQLITE_NOMEM_BKPT;
  }
  return db->errCode;
}